

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void disas_rts(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx;
  TCGContext_conflict2 *pTVar1;
  TCGv_i32 dest;
  TCGv_i32 *ppTVar2;
  TCGv_i32 *ppTVar3;
  
  tcg_ctx = s->uc->tcg_ctx;
  ppTVar3 = s->writeback;
  ppTVar2 = tcg_ctx->cpu_aregs;
  if ((char)s->writeback_mask < '\0') {
    ppTVar2 = ppTVar3;
  }
  dest = gen_load(s,2,ppTVar2[7],0,(uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
  if ((s->writeback_mask & 0x80) == 0) {
    pTVar1 = s->uc->tcg_ctx;
    ppTVar2 = pTVar1->cpu_aregs;
    ppTVar3 = pTVar1->cpu_aregs;
  }
  else {
    ppTVar2 = s->writeback;
  }
  tcg_gen_addi_i32_m68k(tcg_ctx,ppTVar2[7],ppTVar3[7],4);
  gen_jmp(s,dest);
  return;
}

Assistant:

DISAS_INSN(rts)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv tmp;

    tmp = gen_load(s, OS_LONG, QREG_SP, 0, IS_USER(s));
    tcg_gen_addi_i32(tcg_ctx, QREG_SP, QREG_SP, 4);
    gen_jmp(s, tmp);
}